

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int czhelp_zmsg_readv(zmsg_t *self,char *picture,__va_list_tag *argptr)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  void *pvVar5;
  byte *pbVar6;
  zchunk_t *pzVar7;
  zuuid_t *pzVar8;
  zhashx_t *pzVar9;
  uint *in_RDX;
  char *in_RSI;
  zmsg_t *in_RDI;
  zframe_t *curFrame_6;
  binarydata dat;
  NetworkDataType *val_12;
  zhashx_t **val_11;
  zframe_t *curFrame_5;
  void **val_10;
  zframe_t *curFrame_4;
  zuuid_t **val_9;
  zframe_t *curFrame_3;
  zframe_t **val_8;
  zframe_t *curFrame_2;
  zchunk_t **val_7;
  zframe_t *curFrame_1;
  size_t *size;
  byte **data_p;
  zframe_t *curFrame;
  char **val_6;
  char *str_6;
  double *val_5;
  char *str_5;
  uint64_t *val_4;
  char *str_4;
  uint32_t *val_3;
  char *str_3;
  uint16_t *val_2;
  char *str_2;
  uint8_t *val_1;
  char *str_1;
  int *val;
  char *str;
  int retval;
  undefined8 *local_2d0;
  undefined4 in_stack_fffffffffffffd40;
  uint uVar10;
  zmsg_t *in_stack_fffffffffffffd48;
  undefined8 *local_2a0;
  undefined8 *local_280;
  long *local_268;
  undefined8 *local_248;
  undefined8 *local_228;
  undefined8 *local_210;
  long *local_1f8;
  double local_1e0;
  long *local_1d8;
  long local_1c0;
  long *local_1b8;
  undefined4 local_1a4;
  long *local_1a0;
  undefined2 local_18c;
  long *local_188;
  undefined1 local_174;
  long *local_170;
  int local_15c;
  long *local_158;
  zframe_t *local_140 [3];
  undefined1 local_128 [32];
  long *local_108;
  undefined8 *local_100;
  zframe_t *local_f8;
  undefined8 *local_f0;
  zframe_t *local_e8;
  undefined8 *local_e0;
  zframe_t *local_d8;
  undefined8 *local_d0;
  zframe_t *local_c8;
  undefined8 *local_c0;
  zframe_t *local_b8;
  size_t *local_b0;
  undefined8 *local_a8;
  zframe_t *local_a0;
  undefined8 *local_98;
  char *local_90;
  double *local_88;
  char *local_80;
  long *local_78;
  char *local_70;
  undefined4 *local_68;
  char *local_60;
  undefined2 *local_58;
  char *local_50;
  undefined1 *local_48;
  char *local_40;
  int *local_38;
  char *local_30;
  int local_24;
  uint *local_20;
  char *local_18;
  zmsg_t *local_10;
  int local_4;
  
  if ((in_RDI == (zmsg_t *)0x0) || (in_RSI == (char *)0x0)) {
    local_4 = -1;
  }
  else {
    local_24 = 0;
    local_20 = in_RDX;
    local_10 = in_RDI;
    for (local_18 = in_RSI; *local_18 != '\0'; local_18 = local_18 + 1) {
      if (*local_18 == 'i') {
        local_30 = zmsg_popstr(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_158 = (long *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_158 = *(long **)(local_20 + 2);
          *(long **)(local_20 + 2) = local_158 + 1;
        }
        local_38 = (int *)*local_158;
        if (local_38 != (int *)0x0) {
          if (local_30 == (char *)0x0) {
            local_15c = 0;
          }
          else {
            local_15c = atoi(local_30);
          }
          *local_38 = local_15c;
        }
        free(local_30);
        local_30 = (char *)0x0;
      }
      else if (*local_18 == '1') {
        local_40 = zmsg_popstr(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_170 = (long *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_170 = *(long **)(local_20 + 2);
          *(long **)(local_20 + 2) = local_170 + 1;
        }
        local_48 = (undefined1 *)*local_170;
        if (local_48 != (undefined1 *)0x0) {
          if (local_40 == (char *)0x0) {
            local_174 = 0;
          }
          else {
            iVar1 = atoi(local_40);
            local_174 = (undefined1)iVar1;
          }
          *local_48 = local_174;
        }
        free(local_40);
        local_40 = (char *)0x0;
      }
      else if (*local_18 == '2') {
        local_50 = zmsg_popstr(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_188 = (long *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_188 = *(long **)(local_20 + 2);
          *(long **)(local_20 + 2) = local_188 + 1;
        }
        local_58 = (undefined2 *)*local_188;
        if (local_58 != (undefined2 *)0x0) {
          if (local_50 == (char *)0x0) {
            local_18c = 0;
          }
          else {
            lVar2 = atol(local_50);
            local_18c = (undefined2)lVar2;
          }
          *local_58 = local_18c;
        }
        free(local_50);
        local_50 = (char *)0x0;
      }
      else if (*local_18 == '4') {
        local_60 = zmsg_popstr(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_1a0 = (long *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_1a0 = *(long **)(local_20 + 2);
          *(long **)(local_20 + 2) = local_1a0 + 1;
        }
        local_68 = (undefined4 *)*local_1a0;
        if (local_68 != (undefined4 *)0x0) {
          if (local_60 == (char *)0x0) {
            local_1a4 = 0;
          }
          else {
            uVar3 = strtoul(local_60,(char **)0x0,10);
            local_1a4 = (undefined4)uVar3;
          }
          *local_68 = local_1a4;
        }
        free(local_60);
        local_60 = (char *)0x0;
      }
      else if (*local_18 == '8') {
        local_70 = zmsg_popstr(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_1b8 = (long *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_1b8 = *(long **)(local_20 + 2);
          *(long **)(local_20 + 2) = local_1b8 + 1;
        }
        local_78 = (long *)*local_1b8;
        if (local_78 != (long *)0x0) {
          if (local_70 == (char *)0x0) {
            local_1c0 = 0;
          }
          else {
            iVar1 = atoi(local_70);
            local_1c0 = (long)iVar1;
          }
          *local_78 = local_1c0;
        }
        free(local_70);
        local_70 = (char *)0x0;
      }
      else if (*local_18 == 'd') {
        local_80 = zmsg_popstr(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_1d8 = (long *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_1d8 = *(long **)(local_20 + 2);
          *(long **)(local_20 + 2) = local_1d8 + 1;
        }
        local_88 = (double *)*local_1d8;
        if (local_88 != (double *)0x0) {
          if (local_80 == (char *)0x0) {
            local_1e0 = 0.0;
          }
          else {
            local_1e0 = strtod(local_80,(char **)0x0);
          }
          *local_88 = local_1e0;
        }
        free(local_80);
        local_80 = (char *)0x0;
      }
      else if (*local_18 == 's') {
        local_90 = zmsg_popstr(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_1f8 = (long *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_1f8 = *(long **)(local_20 + 2);
          *(long **)(local_20 + 2) = local_1f8 + 1;
        }
        local_98 = (undefined8 *)*local_1f8;
        if (local_98 != (undefined8 *)0x0) {
          *local_98 = local_90;
        }
      }
      else if (*local_18 == 'b') {
        local_a0 = zmsg_pop(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_210 = (undefined8 *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_210 = *(undefined8 **)(local_20 + 2);
          *(undefined8 **)(local_20 + 2) = local_210 + 1;
        }
        local_a8 = (undefined8 *)*local_210;
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_228 = (undefined8 *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_228 = *(undefined8 **)(local_20 + 2);
          *(undefined8 **)(local_20 + 2) = local_228 + 1;
        }
        local_b0 = (size_t *)*local_228;
        if (local_a8 != (undefined8 *)0x0) {
          if (local_a0 == (zframe_t *)0x0) {
            *local_a8 = 0;
            *local_b0 = 0;
          }
          else {
            sVar4 = zframe_size(local_a0);
            *local_b0 = sVar4;
            pvVar5 = malloc(*local_b0);
            *local_a8 = pvVar5;
            pvVar5 = (void *)*local_a8;
            pbVar6 = zframe_data(local_a0);
            memcpy(pvVar5,pbVar6,*local_b0);
          }
        }
        zframe_destroy(&local_a0);
      }
      else if (*local_18 == 'c') {
        local_b8 = zmsg_pop(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_248 = (undefined8 *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_248 = *(undefined8 **)(local_20 + 2);
          *(undefined8 **)(local_20 + 2) = local_248 + 1;
        }
        local_c0 = (undefined8 *)*local_248;
        if (local_c0 != (undefined8 *)0x0) {
          if (local_b8 == (zframe_t *)0x0) {
            *local_c0 = 0;
          }
          else {
            pbVar6 = zframe_data(local_b8);
            sVar4 = zframe_size(local_b8);
            pzVar7 = zchunk_new(pbVar6,sVar4);
            *local_c0 = pzVar7;
          }
        }
        zframe_destroy(&local_b8);
      }
      else if (*local_18 == 'f') {
        local_c8 = zmsg_pop(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_268 = (long *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_268 = *(long **)(local_20 + 2);
          *(long **)(local_20 + 2) = local_268 + 1;
        }
        local_d0 = (undefined8 *)*local_268;
        if (local_d0 == (undefined8 *)0x0) {
          zframe_destroy(&local_c8);
        }
        else {
          *local_d0 = local_c8;
        }
      }
      else if (*local_18 == 'U') {
        local_d8 = zmsg_pop(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_280 = (undefined8 *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_280 = *(undefined8 **)(local_20 + 2);
          *(undefined8 **)(local_20 + 2) = local_280 + 1;
        }
        local_e0 = (undefined8 *)*local_280;
        if (local_e0 != (undefined8 *)0x0) {
          if (local_d8 == (zframe_t *)0x0) {
            *local_e0 = 0;
          }
          else {
            pzVar8 = zuuid_new();
            *local_e0 = pzVar8;
            pzVar8 = (zuuid_t *)*local_e0;
            pbVar6 = zframe_data(local_d8);
            zuuid_set(pzVar8,pbVar6);
          }
        }
        zframe_destroy(&local_d8);
      }
      else if (*local_18 == 'p') {
        local_e8 = zmsg_pop(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_2a0 = (undefined8 *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_2a0 = *(undefined8 **)(local_20 + 2);
          *(undefined8 **)(local_20 + 2) = local_2a0 + 1;
        }
        local_f0 = (undefined8 *)*local_2a0;
        if (local_f0 != (undefined8 *)0x0) {
          if (local_e8 == (zframe_t *)0x0) {
            *local_f0 = 0;
          }
          else {
            sVar4 = zframe_size(local_e8);
            if (sVar4 == 8) {
              pbVar6 = zframe_data(local_e8);
              *local_f0 = *(undefined8 *)pbVar6;
            }
            else {
              local_24 = -1;
            }
          }
        }
        zframe_destroy(&local_e8);
      }
      else if (*local_18 == 'h') {
        local_f8 = zmsg_pop(local_10);
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          in_stack_fffffffffffffd48 = (zmsg_t *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          in_stack_fffffffffffffd48 = *(zmsg_t **)(local_20 + 2);
          *(zlist_t ***)(local_20 + 2) = &in_stack_fffffffffffffd48->frames;
        }
        local_100 = *(undefined8 **)in_stack_fffffffffffffd48;
        if (local_100 != (undefined8 *)0x0) {
          if (local_f8 == (zframe_t *)0x0) {
            *local_100 = 0;
          }
          else {
            pzVar9 = zhashx_unpack(local_f8);
            *local_100 = pzVar9;
          }
        }
        zframe_destroy(&local_f8);
      }
      else if (*local_18 == 'n') {
        uVar10 = *local_20;
        if (uVar10 < 0x29) {
          local_2d0 = (undefined8 *)((long)(int)uVar10 + *(long *)(local_20 + 4));
          *local_20 = uVar10 + 8;
        }
        else {
          local_2d0 = *(undefined8 **)(local_20 + 2);
          *(undefined8 **)(local_20 + 2) = local_2d0 + 1;
        }
        local_108 = (long *)*local_2d0;
        binarydata::binarydata((binarydata *)0x1f2cb0);
        CZHelp::zmsg_popNDT(in_stack_fffffffffffffd48,
                            (binarydata *)CONCAT44(uVar10,in_stack_fffffffffffffd40));
        (**(code **)(*local_108 + 0x18))(local_108,local_128);
        binarydata::~binarydata((binarydata *)0x1f2ceb);
      }
      else if (*local_18 == 'z') {
        local_140[0] = zmsg_pop(local_10);
        if ((local_140[0] != (zframe_t *)0x0) && (sVar4 = zframe_size(local_140[0]), sVar4 != 0)) {
          local_24 = -1;
        }
        zframe_destroy(local_140);
      }
      else {
        std::operator<<((ostream *)&std::cout,
                        "ERROR: formated data type not supported. (CZHelp::zmsg_read)\n");
      }
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

int czhelp_zmsg_readv(zmsg_t* self, const char* picture, va_list argptr) {
    int retval = -1;
    if (self == NULL || picture == NULL)
        return(retval);
    retval = 0;
    while(*picture) {
        if (*picture == 'i') { //int
            char *str = zmsg_popstr(self);
            int *val = va_arg(argptr, int *); //retrieve int from the input list of argumetns
            if (val)
                *val = str? atoi (str): 0;
            freen(str);

        }
        else if (*picture == '1') { //uint8_t
            char *str = zmsg_popstr (self);
            uint8_t *val = va_arg (argptr, uint8_t *);
            if (val)
                *val = str? (uint8_t) atoi (str): 0;
            freen(str);
        }
        else if (*picture == '2') { //uint16_t
            char *str = zmsg_popstr (self);
            uint16_t *val = va_arg (argptr, uint16_t *);
            if (val)
                *val = str? (uint16_t) atol (str): 0;
            freen(str);
        }
        else if (*picture == '4') { //uint32_t
            char *str = zmsg_popstr (self);
            uint32_t *val = va_arg (argptr, uint32_t *);
            if (val)
                *val = str? (uint32_t) strtoul(str, NULL, 10): 0;
            freen(str);
        }
        else if (*picture == '8') { //uint64_t
            char *str = zmsg_popstr (self);
            uint64_t *val = va_arg (argptr, uint64_t *);
            if (val)
                *val = str? (uint64_t) atoi (str): 0;
            freen(str);
        }
        else if (*picture == 'd') {
            char *str = zmsg_popstr(self);
            double *val = va_arg(argptr, double *);
            if (val)
                *val = str ? (double) strtod(str, NULL) : 0;
            freen(str);
        }
        else if (*picture == 's') { //string
            char *str = zmsg_popstr(self);
            char **val = va_arg(argptr, char **);
            if (val) {
                *val = str;
            }
        }
        else if (*picture == 'b') { //byte *, size_t (2 args)
            zframe_t *curFrame = zmsg_pop (self);
            byte **data_p = va_arg (argptr, byte **);
            size_t *size = va_arg (argptr, size_t *);
            if (data_p) {
                if (curFrame) {
                    *size = zframe_size (curFrame);
                    *data_p = (byte *) malloc (*size);
                    memcpy (*data_p, zframe_data (curFrame), *size);
                }
                else {
                    *data_p = NULL;
                    *size = 0;
                }
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'c') { //zchunk_t *
            zframe_t *curFrame = zmsg_pop (self);
            zchunk_t **val = va_arg (argptr, zchunk_t **);
            if (val) {
                if (curFrame)
                    *val = zchunk_new (zframe_data (curFrame), zframe_size (curFrame));
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'f') { //zframe_t *
            zframe_t *curFrame = zmsg_pop (self);
            zframe_t **val = va_arg (argptr, zframe_t **);
            if (val)
                *val = curFrame;
            else
                zframe_destroy (&curFrame);
        }
        else if (*picture == 'U') { //zuuid_t *
            zframe_t *curFrame = zmsg_pop (self);
            zuuid_t **val = va_arg (argptr, zuuid_t **);
            if (val) {
                if (curFrame) {
                    *val = zuuid_new ();
                    zuuid_set (*val, zframe_data (curFrame));
                }
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'p') { //void *
            zframe_t *curFrame = zmsg_pop (self);
            void **val = va_arg (argptr, void **);
            if (val) {
                if (curFrame) {
                    if (zframe_size (curFrame) == sizeof (void *))
                        *val = *((void **) zframe_data (curFrame));
                    else
                        retval = -1;
                }
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'h') { //zhashx_t *
            zframe_t *curFrame = zmsg_pop (self);
            zhashx_t **val = va_arg (argptr, zhashx_t **);
            if (val) {
                if (curFrame)
                    *val = zhashx_unpack (curFrame);
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'n') { //NetworkDataType
            NetworkDataType *val = va_arg(argptr, NetworkDataType *);
            binarydata dat;
            CZHelp::zmsg_popNDT(self, dat);
            val->decode(dat);
        }
        else if (*picture == 'z') { //sends zero-frame (0 args)
            zframe_t *curFrame = zmsg_pop (self);
            if (curFrame && zframe_size (curFrame) != 0)
                retval = -1;
            zframe_destroy (&curFrame);
        }
        else {
            std::cout << "ERROR: formated data type not supported. (CZHelp::zmsg_read)\n";
        }
        picture++;
    }
    return(retval);
}